

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Bounds3f * __thiscall
pbrt::AnimatedTransform::MotionBounds
          (Bounds3f *__return_storage_ptr__,AnimatedTransform *this,Bounds3f *b)

{
  undefined8 uVar1;
  int corner;
  int corner_00;
  ulong uVar3;
  undefined1 auVar2 [64];
  undefined1 auVar5 [16];
  Point3<float> PVar6;
  Tuple3<pbrt::Point3,_float> local_70;
  Bounds3<float> local_60;
  Bounds3f local_48;
  undefined1 auVar4 [56];
  
  if (this->actuallyAnimated == false) {
    Transform::operator()(__return_storage_ptr__,&this->startTransform,b);
  }
  else if (this->hasRotation == false) {
    Transform::operator()(&local_60,&this->startTransform,b);
    Transform::operator()(&local_48,&this->endTransform,b);
    Union<float>(__return_storage_ptr__,&local_60,&local_48);
  }
  else {
    auVar5._8_4_ = 0xff7fffff;
    auVar5._0_8_ = 0xff7fffffff7fffff;
    auVar5._12_4_ = 0xff7fffff;
    corner_00 = 0;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    *(undefined8 *)&(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
         0xff7fffff7f7fffff;
    uVar1 = vmovlps_avx(auVar5);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar1;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z =
         (float)(int)((ulong)uVar1 >> 0x20);
    uVar3 = 0xff7fffff7f7fffff;
    while( true ) {
      auVar4 = ZEXT856(uVar3);
      if (corner_00 == 8) break;
      PVar6 = Bounds3<float>::Corner(b,corner_00);
      local_70.z = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
      auVar2._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar2._8_56_ = auVar4;
      local_70._0_8_ = vmovlps_avx(auVar2._0_16_);
      BoundPointMotion(&local_48,this,(Point3f *)&local_70);
      Union<float>(&local_60,__return_storage_ptr__,&local_48);
      corner_00 = corner_00 + 1;
      (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
           local_60.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z =
           local_60.pMax.super_Tuple3<pbrt::Point3,_float>.z;
      (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x =
           local_60.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
           local_60.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      *(undefined8 *)&(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
           local_60._8_8_;
      uVar3 = local_60._8_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Bounds3f AnimatedTransform::MotionBounds(const Bounds3f &b) const {
    // Handle easy cases for _Bounds3f_ motion bounds
    if (!actuallyAnimated)
        return startTransform(b);
    if (!hasRotation)
        return Union(startTransform(b), endTransform(b));

    // Return motion bounds accounting for animated rotation
    Bounds3f bounds;
    for (int corner = 0; corner < 8; ++corner)
        bounds = Union(bounds, BoundPointMotion(b.Corner(corner)));
    return bounds;
}